

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

bool __thiscall sing::HttpContext::parseRequest(HttpContext *this)

{
  char *pcVar1;
  char local_31;
  char *local_30;
  char *colon;
  char *crlf_1;
  char *crlf;
  bool hasMore;
  HttpContext *pHStack_10;
  bool ok;
  HttpContext *this_local;
  
  crlf._7_1_ = 1;
  crlf._6_1_ = 1;
  pHStack_10 = this;
  while ((crlf._6_1_ & 1) != 0) {
    if (this->state == REQUEST_LINE) {
      crlf_1 = Buffer::findCRLF(&this->input);
      if (crlf_1 == (char *)0x0) {
        crlf._6_1_ = 0;
      }
      else {
        pcVar1 = Buffer::peek(&this->input);
        crlf._7_1_ = parseRequestLine(this,pcVar1,crlf_1);
        if ((bool)crlf._7_1_) {
          Buffer::retrieveUntil(&this->input,crlf_1 + 2);
          this->state = HEADERS;
        }
        else {
          crlf._6_1_ = 0;
        }
      }
    }
    else if (this->state == HEADERS) {
      colon = Buffer::findCRLF(&this->input);
      if (colon == (char *)0x0) {
        crlf._6_1_ = 0;
      }
      else {
        pcVar1 = Buffer::peek(&this->input);
        local_31 = ':';
        local_30 = std::find<char_const*,char>(pcVar1,colon,&local_31);
        if (local_30 == colon) {
          this->state = BODY;
          crlf._6_1_ = 1;
        }
        else {
          pcVar1 = Buffer::peek(&this->input);
          HttpRequest::addHeader(&this->request,pcVar1,local_30,colon);
        }
        Buffer::retrieveUntil(&this->input,colon + 2);
      }
    }
    else if (this->state == BODY) {
      this->state = FINSH;
      crlf._6_1_ = 0;
    }
  }
  return (bool)(crlf._7_1_ & 1);
}

Assistant:

bool HttpContext::parseRequest(){
    bool ok = true;
    bool hasMore = true;
    while (hasMore)
    {
        if (state == REQUEST_LINE)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                ok = parseRequestLine(input.peek(),crlf);
                if(ok){
                    input.retrieveUntil(crlf + 2);
                    state = HEADERS;
                }else{
                    hasMore = false;
                }
            }else{
                hasMore = false;
            }

        }else if (state == HEADERS)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                const char* colon = std::find(input.peek(),crlf,':');
                if(colon!=crlf){
                    request.addHeader(input.peek(),colon,crlf);
                }else{
                    state = BODY;
                    hasMore = true;
                }
                input.retrieveUntil(crlf + 2);

            }else{
                hasMore = false;
            }

        }else if (state==BODY)
        {
            //TO ADD: process requestbody
            state = FINSH;
            hasMore = false;
        }
    }

    return ok;
}